

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

bool tinygltf::ParseNumberProperty
               (double *ret,string *err,json *o,string *property,bool required,string *parent_node)

{
  bool bVar1;
  reference o_00;
  double numberValue;
  json_const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  double local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  json_const_iterator local_58;
  
  local_58.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)0x0;
  local_58.m_object = (pointer)0x0;
  local_58.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_58.m_it.primitive_iterator.m_it = -0x8000000000000000;
  bVar1 = anon_unknown_58::FindMember(o,(property->_M_dataplus)._M_p,&local_58);
  if (bVar1) {
    o_00 = nlohmann::detail::
           iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
           ::operator*(&local_58);
    bVar1 = anon_unknown_58::GetNumber(o_00,&local_80);
    if (bVar1) {
      if (ret != (double *)0x0) {
        *ret = local_80;
      }
    }
    else if (required && err != (string *)0x0) {
      std::operator+(&local_78,"\'",property);
      std::operator+(&local_a0,&local_78,"\' property is not a number type.\n");
      std::__cxx11::string::append((string *)err);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_78);
    }
  }
  else {
    if (required && err != (string *)0x0) {
      std::operator+(&local_78,"\'",property);
      std::operator+(&local_a0,&local_78,"\' property is missing");
      std::__cxx11::string::append((string *)err);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_78);
      if (parent_node->_M_string_length != 0) {
        std::operator+(&local_a0," in ",parent_node);
        std::__cxx11::string::append((string *)err);
        std::__cxx11::string::~string((string *)&local_a0);
      }
      std::__cxx11::string::append((char *)err);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool ParseNumberProperty(double *ret, std::string *err, const json &o,
                                const std::string &property,
                                const bool required,
                                const std::string &parent_node = "") {
  json_const_iterator it;

  if (!FindMember(o, property.c_str(), it)) {
    if (required) {
      if (err) {
        (*err) += "'" + property + "' property is missing";
        if (!parent_node.empty()) {
          (*err) += " in " + parent_node;
        }
        (*err) += ".\n";
      }
    }
    return false;
  }

  double numberValue;
  bool isNumber = GetNumber(GetValue(it), numberValue);

  if (!isNumber) {
    if (required) {
      if (err) {
        (*err) += "'" + property + "' property is not a number type.\n";
      }
    }
    return false;
  }

  if (ret) {
    (*ret) = numberValue;
  }

  return true;
}